

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O3

bool __thiscall
mprpc::MpRpcServer::send_rsp
          (MpRpcServer *this,shared_ptr<mprpc::ClientConnection> *conn,
          shared_ptr<mprpc::MpRpcMessage> *req,void *data,size_t size)

{
  char *pcVar1;
  long lVar2;
  ssize_t sVar3;
  MsgPackPacker *this_00;
  int __flags;
  uchar d;
  MsgPackPacker pk;
  char local_59;
  MsgPackPacker local_58;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  __flags = (int)size;
  local_58.pk.data = &local_58;
  local_58.sb.size = 0;
  local_58.sb.data = (char *)0x0;
  local_58.sb.alloc = 0;
  local_58.pk.callback = msgpack_sbuffer_write;
  pcVar1 = (char *)malloc(0x2000);
  if (pcVar1 != (char *)0x0) {
    local_58.sb.alloc = 0x2000;
    *pcVar1 = -0x7c;
    local_58.sb.size = 1;
    local_58.sb.data = pcVar1;
  }
  MsgPackPacker::pack_map_item
            (&local_58,"id",
             ((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->id
            );
  MsgPackPacker::pack_map_item
            (&local_58,"method",
             &((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              method);
  local_59 = -0x5a;
  (*local_58.pk.callback)(local_58.pk.data,&local_59,1);
  (*local_58.pk.callback)(local_58.pk.data,"result",6);
  (*local_58.pk.callback)(local_58.pk.data,(char *)data,size);
  local_59 = -0x5b;
  (*local_58.pk.callback)(local_58.pk.data,&local_59,1);
  (*local_58.pk.callback)(local_58.pk.data,"debug",5);
  local_59 = -0x7e;
  (*local_58.pk.callback)(local_58.pk.data,&local_59,1);
  MsgPackPacker::pack_map_item
            (&local_58,"recv_time",
             (((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             recv_time).__d.__r / 1000);
  lVar2 = std::chrono::_V2::system_clock::now();
  this_00 = &local_58;
  MsgPackPacker::pack_map_item(this_00,"send_time",lVar2 / 1000);
  local_30 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  sVar3 = send((MpRpcServer *)this_00,(int)&local_30,local_58.sb.data,local_58.sb.size,__flags);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  free(local_58.sb.data);
  return (bool)(char)sVar3;
}

Assistant:

bool MpRpcServer::send_rsp(shared_ptr<mprpc::ClientConnection> conn,
        shared_ptr<mprpc::MpRpcMessage> req,
        const void* data,
        size_t size)
    {
        MsgPackPacker pk;

        pk.pack_map(4);
        pk.pack_map_item("id", req->id);
        pk.pack_map_item("method", req->method);
        pk.pack_string("result");
        msgpack_pack_str_body(&pk.pk, data, size);

        pk.pack_string("debug");
        pk.pack_map(2);
        pk.pack_map_item("recv_time", (uint64_t)time_point_cast<microseconds>(req->recv_time).time_since_epoch().count());
        pk.pack_map_item("send_time", (uint64_t)time_point_cast<microseconds>(system_clock::now()).time_since_epoch().count());

        return send(conn, pk.sb.data, pk.sb.size);
    }